

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_string_field.h
# Opt level: O0

void google::protobuf::internal::InlinedStringField::InternalSwap
               (InlinedStringField *lhs,bool lhs_arena_dtor_registered,MessageLite *lhs_msg,
               InlinedStringField *rhs,bool rhs_arena_dtor_registered,MessageLite *rhs_msg,
               Arena *arena)

{
  string *psVar1;
  MessageLite *rhs_msg_local;
  bool rhs_arena_dtor_registered_local;
  InlinedStringField *rhs_local;
  MessageLite *lhs_msg_local;
  bool lhs_arena_dtor_registered_local;
  InlinedStringField *lhs_local;
  
  psVar1 = get_mutable_abi_cxx11_(lhs);
  get_mutable_abi_cxx11_(rhs);
  std::__cxx11::string::swap((string *)psVar1);
  return;
}

Assistant:

inline PROTOBUF_NDEBUG_INLINE void InlinedStringField::InternalSwap(
    InlinedStringField* lhs, bool lhs_arena_dtor_registered,
    MessageLite* lhs_msg,  //
    InlinedStringField* rhs, bool rhs_arena_dtor_registered,
    MessageLite* rhs_msg, Arena* arena) {
#ifdef GOOGLE_PROTOBUF_INTERNAL_DONATE_STEAL_INLINE
  lhs->get_mutable()->swap(*rhs->get_mutable());
  if (!lhs_arena_dtor_registered && rhs_arena_dtor_registered) {
    lhs_msg->OnDemandRegisterArenaDtor(arena);
  } else if (lhs_arena_dtor_registered && !rhs_arena_dtor_registered) {
    rhs_msg->OnDemandRegisterArenaDtor(arena);
  }
#else
  (void)arena;
  (void)lhs_arena_dtor_registered;
  (void)rhs_arena_dtor_registered;
  (void)lhs_msg;
  (void)rhs_msg;
  lhs->get_mutable()->swap(*rhs->get_mutable());
#endif
}